

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O3

void crossRatio(structure_light *light,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  float fVar1;
  long lVar2;
  double dVar3;
  float fVar4;
  structure_light *psVar5;
  int iVar6;
  ostream *poVar7;
  _OutputArray *p_Var8;
  long *plVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  double dVar15;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempCornerLinePoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCrossPoint;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempWorldPoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCornerPoint;
  Mat Rvec;
  Mat RMat1;
  Mat T1;
  Mat RMat2;
  undefined1 local_260 [8];
  value_type *local_258;
  Size local_250;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> local_248;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_230;
  structure_light *local_218;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> local_210;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_1f8;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *local_1e0;
  ulong local_1d8;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *local_1d0;
  _OutputArray local_1c8;
  value_type local_1b0 [8];
  Mat local_150 [16];
  double *local_140;
  long *local_108;
  Mat local_f0 [16];
  double *local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  if (0 < imageCount) {
    local_1d0 = &light->lightPlanePoint;
    uVar12 = 0;
    iVar6 = imageCount;
    local_218 = light;
    local_1e0 = crossPoint;
    do {
      if (((light->isRecognize).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6 & 0x3ffffff]
           >> (uVar12 & 0x3f) & 1) != 0) {
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                  (&local_230,
                   (local_1e0->
                   super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar12);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                  (&local_1f8,
                   (light->calibImagePoint).
                   super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12);
        local_1d8 = uVar12;
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
                  (&local_210,
                   (light->calibBoardPoint).
                   super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12);
        local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar13 = 4;
          uVar11 = 0;
          do {
            iVar6 = (int)uVar11;
            iVar10 = iVar6 + patternSize.width * 2;
            fVar1 = *(float *)((long)&(local_210.
                                       super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar13);
            local_1b0[0].x = (float)iVar6 * patternLength.width;
            fVar4 = (local_210.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[patternSize.width + iVar6].y -
                    local_210.
                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar10].y) *
                    (((local_1f8.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar11].y -
                      local_1f8.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar10].y) /
                     (local_1f8.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[patternSize.width + iVar6].y -
                     local_1f8.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar10].y)) /
                    ((local_1f8.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar11].y -
                     local_230.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11].y) /
                    (local_1f8.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[patternSize.width + iVar6].y -
                    local_230.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar11].y)));
            fVar14 = fVar1 - local_210.
                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar10].y;
            local_1b0[0].y =
                 (fVar1 * fVar4 -
                 local_210.
                 super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[patternSize.width + iVar6].y * fVar14) /
                 (fVar4 - fVar14);
            local_1b0[0].z = 0.0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ccs Point:",10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
            poVar7 = std::ostream::_M_insert<double>((double)local_1b0[0].x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_1b0[0].y);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_1b0[0].z);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
            std::ostream::put(-0x38);
            std::ostream::flush();
            std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                      (&local_248,local_1b0);
            uVar11 = uVar11 + 1;
            lVar13 = lVar13 + 0xc;
          } while (uVar11 < (ulong)((long)local_230.
                                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_230.
                                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        psVar5 = local_218;
        cv::Mat::Mat((Mat *)local_1b0,
                     (local_218->R).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar12 * 0x60);
        cv::Mat::Mat(local_f0,(psVar5->T).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar12 * 0x60);
        cv::Mat::Mat(local_150);
        cv::Mat::Mat(local_90);
        local_250.width = 0;
        local_250.height = 0;
        local_260._0_4_ = 0x1010000;
        local_258 = local_1b0;
        local_1c8.super__InputArray.sz.width = 0;
        local_1c8.super__InputArray.sz.height = 0;
        local_1c8.super__InputArray.flags = 0x2010000;
        local_1c8.super__InputArray.obj = local_150;
        p_Var8 = (_OutputArray *)cv::noArray();
        cv::Rodrigues((_InputArray *)local_260,&local_1c8,p_Var8);
        if (local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar13 = 4;
          uVar12 = 0;
          do {
            dVar15 = (double)*(float *)((long)&(local_248.
                                                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->x +
                                       lVar13);
            lVar2 = *local_108;
            dVar3 = (double)*(float *)((long)local_248.
                                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar13 + -4
                                      );
            local_260._4_4_ =
                 (float)(*(double *)((long)local_140 + lVar2) * dVar3 +
                         dVar15 * *(double *)((long)local_140 + lVar2 + 8) +
                        *(double *)((long)local_e0 + *local_a8));
            local_260._0_4_ =
                 (float)((double)*(float *)((long)local_248.
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar13 + -4) * *local_140 + local_140[1] * dVar15 +
                        *local_e0);
            local_258 = (value_type *)
                        CONCAT44(local_258._4_4_,
                                 (float)(dVar3 * *(double *)((long)local_140 + lVar2 * 2) +
                                         (double)*(float *)((long)&(local_248.
                                                                                                                                        
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                                  lVar13) *
                                         *(double *)((long)local_140 + lVar2 * 2 + 8) +
                                        *(double *)((long)local_e0 + *local_a8 * 2)));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"wcs Point:",10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
            poVar7 = std::ostream::_M_insert<double>((double)(float)local_260._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)(float)local_260._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_258._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
            std::ostream::put(-0x38);
            plVar9 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                      (local_1d0,(value_type *)local_260);
            uVar12 = uVar12 + 1;
            uVar11 = ((long)local_248.
                            super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_248.
                            super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            lVar13 = lVar13 + 0xc;
          } while (uVar12 <= uVar11 && uVar11 - uVar12 != 0);
        }
        uVar12 = local_1d8;
        light = local_218;
        if (local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_248.
               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (local_210.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_210.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_210.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_210.
               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (local_1f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_1f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_1f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if (local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        cv::Mat::~Mat(local_90);
        cv::Mat::~Mat(local_150);
        cv::Mat::~Mat(local_f0);
        cv::Mat::~Mat((Mat *)local_1b0);
        if (local_248.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_210.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar6 = imageCount;
        if (local_230.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_230.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          iVar6 = imageCount;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)iVar6);
  }
  return;
}

Assistant:

void crossRatio(structure_light &light, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (light.isRecognize[i] == false)
            continue;
        vector<Point2f> tempCrossPoint = crossPoint[i];//某一张图中的光条上的7个点的二维坐标
        vector<Point2f> tempCornerPoint = light.calibImagePoint[i];//第i个靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point3f> tempWorldPoint = light.calibBoardPoint[i];//第i个靶标平面上圆形标记中心的点（49个）的三维点坐标
        vector<Point3f> tempCornerLinePoint;//用于存光条上的点的三维坐标
        //计算第i个靶标上的7个光条上的点的三维坐标（靶标坐标系下）循环7次
        for (int m = 0; m < tempCrossPoint.size(); m++)//循环7次
        {
            //读取每条圆斑点形成直线上前三个特征点的坐标
            Point2f a, b, c;
            Point3f A, B, C;
            a = tempCornerPoint[m];
            b = tempCornerPoint[patternSize.width+m];
            c = tempCornerPoint[2 * patternSize.width+m];
            A = tempWorldPoint[m];
            B = tempWorldPoint[patternSize.width + m];
            C = tempWorldPoint[2 * patternSize.width + m];

            //计算交比
            double crossRatio = ((a.y - c.y) / (b.y - c.y)) / ((a.y - tempCrossPoint[m].y) / (b.y - tempCrossPoint[m].y));
            //double crossRatio = ((a.x - c.x) / (b.x - c.x)) / ((a.x - tempCrossPoint[m].x) / (b.x - tempCrossPoint[m].x));
            //已知4个点的图像坐标与3个点世界坐标，可以计算其中1点的世界坐标（现在已知三个圆形标记中心和一个光条上的点的图像坐标，和三个标记点的三维坐标）
            Point3f crPoint;
			crPoint.x = m * patternLength.width;
			crPoint.y = (crossRatio*(B.y - C.y)*A.y - B.y*(A.y - C.y)) / (crossRatio*(B.y - C.y) - (A.y - C.y));//解出Y坐标
            crPoint.z = 0;
            cout << "ccs Point:" << crPoint << endl;
            tempCornerLinePoint.push_back(crPoint);
        }

        Mat Rvec = light.R[i]; Mat T1 = light.T[i];//靶标坐标系和摄像机坐标系之间的旋转平移矩阵
        Mat RMat1,RMat2;
        Rodrigues(Rvec, RMat1);//1x3 -> 3x3 旋转向量（1x3）与旋转矩阵（3x3），二者可以通过罗德里格斯相互转化

        //将靶标坐标系下的三维坐标转换成摄像机坐标系下的三维坐标
        vector<Point3f> tempPoint;
        for (int n = 0; n < tempCornerLinePoint.size(); n++)
        {
            Point3f realPoint;//摄像机坐标系下的坐标，接下来利用旋转变换矩阵将坐标转化
            realPoint.x = RMat1.at<double>(0, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(0, 1)*tempCornerLinePoint[n].y + T1.at<double>(0, 0);
            realPoint.y = RMat1.at<double>(1, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(1, 1)*tempCornerLinePoint[n].y + T1.at<double>(1, 0);
            realPoint.z = RMat1.at<double>(2, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(2, 1)*tempCornerLinePoint[n].y + T1.at<double>(2, 0);
            cout << "wcs Point:" << realPoint << endl << endl;
            light.lightPlanePoint.push_back(realPoint);
        }
        tempCornerLinePoint.clear();
        tempWorldPoint.clear();
        tempCornerPoint.clear();
        tempCrossPoint.clear();
    }
}